

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O1

void __thiscall PrintLanguage::recurse(PrintLanguage *this)

{
  uint4 uVar1;
  int iVar2;
  pointer pNVar3;
  Varnode *vn;
  PcodeOp *op;
  TypeOp *pTVar4;
  int iVar5;
  
  uVar1 = this->mods;
  iVar2 = this->pending;
  iVar5 = (int)((ulong)((long)(this->nodepend).
                              super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->nodepend).
                             super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  this->pending = iVar5;
  while (iVar2 < iVar5) {
    pNVar3 = (this->nodepend).
             super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    vn = pNVar3[-1].vn;
    op = pNVar3[-1].op;
    this->mods = pNVar3[-1].vnmod;
    (this->nodepend).
    super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>.
    _M_impl.super__Vector_impl_data._M_finish = pNVar3 + -1;
    this->pending = iVar5 + -1;
    if ((vn->flags & 0x40) == 0) {
      pushVnExplicit(this,vn,op);
    }
    else {
      pTVar4 = vn->def->opcode;
      (*pTVar4->_vptr_TypeOp[9])(pTVar4,this);
    }
    iVar5 = (int)((ulong)((long)(this->nodepend).
                                super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->nodepend).
                               super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    this->pending = iVar5;
  }
  this->mods = uVar1;
  return;
}

Assistant:

void PrintLanguage::recurse(void)

{
  uint4 modsave = mods;
  int4 final = pending;		// Already claimed
  pending = nodepend.size();	// Lay claim to the rest
  while(final < pending) {
    const Varnode *vn = nodepend.back().vn;
    const PcodeOp *op = nodepend.back().op;
    mods = nodepend.back().vnmod;
    nodepend.pop_back();
    pending -= 1;
    if (vn->isImplied())
      vn->getDef()->push(this);
    else
      pushVnExplicit(vn,op);
    pending = nodepend.size();
  }
  mods = modsave;
}